

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretVStemHM
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  EStatusCode EVar1;
  int iVar2;
  size_type sVar3;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  sVar3 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                    (&this->mOperandStack);
  EVar1 = AddStemsCount(this,(unsigned_short)(sVar3 >> 1));
  if (EVar1 == eSuccess) {
    iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x10])();
    if (iVar2 == 0) {
      ClearStack(this);
      this_local = (CharStringType2Interpreter *)inProgramCounter;
    }
    else {
      this_local = (CharStringType2Interpreter *)0x0;
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretVStemHM(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = AddStemsCount((unsigned short)(mOperandStack.size() / 2));
	if(status != eSuccess)
		return NULL;	

	status = mImplementationHelper->Type2Vstemhm(mOperandStack);
	if(status != eSuccess)
		return NULL;

	ClearStack();
	return inProgramCounter;
}